

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseData.cpp
# Opt level: O1

bool __thiscall
SGParser::Generator::StdGrammarParseData::CreateSymbolMap
          (StdGrammarParseData *this,StdGrammarParseHandler *data,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          *symbols,vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
                   *productions,vector<unsigned_int,_std::allocator<unsigned_int>_> *startSymbols)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *this_01;
  _Rb_tree_header *p_Var2;
  _Rb_tree_header *p_Var3;
  char cVar4;
  char cVar5;
  pointer pPVar6;
  size_t line;
  key_type *pkVar7;
  iterator __position;
  undefined1 auVar8 [8];
  pointer puVar9;
  key_type kVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  mapped_type_conflict1 *pmVar14;
  ulong uVar15;
  mapped_type *this_02;
  mapped_type *pmVar16;
  mapped_type *pmVar17;
  iterator iVar18;
  uint *puVar19;
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  *p_Var20;
  mapped_type *pmVar21;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar22;
  pointer pbVar23;
  uint prec;
  uint uVar24;
  _Base_ptr p_Var25;
  uint *pright;
  _Rb_tree_header *p_Var26;
  ulong uVar27;
  char *pcVar28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *symbol;
  key_type *pkVar29;
  _Base_ptr p_Var30;
  pointer puVar31;
  ulong uVar32;
  pointer __k;
  long lVar33;
  bool bVar34;
  bool bVar35;
  undefined1 local_298 [8];
  Production p;
  map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
  reduceData;
  size_t errorCount;
  undefined1 local_158 [8];
  anon_class_16_2_e3ac8062 checkForErrorAndReport;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  nonTerminals;
  uint *puStack_108;
  vector<unsigned_int,_std::allocator<unsigned_int>_> rhs;
  uint local_ac;
  uint *puStack_a8;
  uint nonterm;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vStack_a0;
  undefined1 auStack_88 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> leftSymbolId;
  undefined1 auStack_68 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> leftSymbolErrorTerminal;
  uint local_38;
  key_type local_34 [2];
  uint symbolId;
  
  checkForErrorAndReport.this =
       (StdGrammarParseData *)&reduceData._M_t._M_impl.super__Rb_tree_header._M_node_count;
  reduceData._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  nonTerminals._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&nonTerminals;
  nonTerminals._M_t._M_impl._0_4_ = 0;
  nonTerminals._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  nonTerminals._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  nonTerminals._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  __k = (data->Productions).
        super__Vector_base<SGParser::Generator::StdGrammarParseHandler::ProductionData,_std::allocator<SGParser::Generator::StdGrammarParseHandler::ProductionData>_>
        ._M_impl.super__Vector_impl_data._M_start;
  pPVar6 = (data->Productions).
           super__Vector_base<SGParser::Generator::StdGrammarParseHandler::ProductionData,_std::allocator<SGParser::Generator::StdGrammarParseHandler::ProductionData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_158 = (undefined1  [8])this;
  nonTerminals._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       nonTerminals._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  vStack_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)symbols;
  if (__k != pPVar6) {
    uVar11 = (int)((ulong)((long)(this->UserLex).TokenLexemes.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->UserLex).TokenLexemes.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 2) + 2;
    nonTerminals._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)&(symbols->_M_t)._M_impl.super__Rb_tree_header;
    this_00 = &(this->UserLex).LexemeAliasToToken;
    p_Var1 = &(this->UserLex).LexemeAliasToToken._M_t._M_impl.super__Rb_tree_header;
    this_01 = &(this->UserLex).LexemeNameToToken;
    p_Var2 = &(this->UserLex).LexemeNameToToken._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = &(this->UserLex).Precedence._M_t._M_impl.super__Rb_tree_header;
    local_38 = 0;
    do {
      local_298 = (undefined1  [8])&p.Name._M_string_length;
      p.Name._M_dataplus._M_p = (pointer)0x0;
      p.Name._M_string_length._0_1_ = 0;
      p.Line._4_4_ = 0;
      p.ReduceOverrides._M_t._M_impl._0_4_ = 0;
      p.ReduceOverrides._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      p.ReduceOverrides._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      p.Line._0_1_ = 0;
      p.Left = 0;
      p.Length = 0;
      p.pRight = (uint *)0x0;
      p.Name.field_2._8_8_ = 0;
      p.Id = 0;
      p.Precedence = 0;
      p.ReduceOverrides._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)&p.ReduceOverrides;
      p.ConflictActions._M_t._M_impl._0_4_ = 0;
      p.ConflictActions._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      p.ConflictActions._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      p.LeftChain.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      p.LeftChain.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      p.ReduceOverrides._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      p.ReduceOverrides._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      p.ConflictActions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)&p.ConflictActions;
      p.ConflictActions._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      rhs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      puStack_108 = (uint *)0x0;
      rhs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      reduceData._M_t._M_impl._0_4_ = 0;
      reduceData._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      reduceData._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      reduceData._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&reduceData;
      reduceData._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      p.ReduceOverrides._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           p.ReduceOverrides._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p.ConflictActions._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           p.ConflictActions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      reduceData._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           reduceData._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                ::operator[](&data->ProductionLines,&__k->Name);
      line = *pmVar14;
      pbVar23 = (__k->Right).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((__k->Right).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish == pbVar23) {
        uVar27 = 0;
        rhs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        prec = 0;
      }
      else {
        prec = 0;
        rhs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        uVar27 = 0;
        do {
          cVar4 = *pbVar23[uVar27]._M_dataplus._M_p;
          if (cVar4 == '*') {
            rhs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)CONCAT71((int7)(uVar27 * 0x20 >> 8),1);
          }
          else {
            pkVar29 = pbVar23 + uVar27;
            if (cVar4 == '$') {
              std::__cxx11::string::substr((ulong)auStack_88,(ulong)pkVar29);
              std::__cxx11::string::operator=((string *)pkVar29,(string *)auStack_88);
              if (auStack_88 !=
                  (undefined1  [8])
                  &leftSymbolId.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish) {
                operator_delete((void *)auStack_88,
                                (long)leftSymbolId.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish + 1);
              }
            }
            local_34[0] = 0xffffffff;
            pcVar28 = (pkVar29->_M_dataplus)._M_p;
            cVar5 = *pcVar28;
            uVar13 = uVar11;
            if (cVar5 == '%') {
              if (pcVar28[6] != '(') goto LAB_001313fa;
              iVar18 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                       ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                               *)vStack_a0.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,pkVar29);
              if (iVar18._M_node !=
                  (_Base_ptr)nonTerminals._M_t._M_impl.super__Rb_tree_header._M_node_count) {
                pmVar21 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                        *)vStack_a0.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,pkVar29
                                      );
                goto LAB_00131425;
              }
              uVar13 = uVar11 + 1;
              local_34[0] = uVar11 | 0x40000000;
            }
            else {
              if (cVar5 == '\'') {
                std::__cxx11::string::substr((ulong)auStack_88,(ulong)pkVar29);
                std::__cxx11::string::operator=((string *)pkVar29,(string *)auStack_88);
                if (auStack_88 !=
                    (undefined1  [8])
                    &leftSymbolId.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish) {
                  operator_delete((void *)auStack_88,
                                  (long)leftSymbolId.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_finish + 1);
                }
                iVar18 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         ::find(&this_00->_M_t,pkVar29);
                if ((_Rb_tree_header *)iVar18._M_node == p_Var1) {
                  CreateSymbolMap::anon_class_16_2_e3ac8062::operator()
                            ((anon_class_16_2_e3ac8062 *)local_158,line,
                             "Undefined alias referenced - \'%s\'",(pkVar29->_M_dataplus)._M_p);
                  goto LAB_0013142a;
                }
                pmVar21 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          ::operator[](this_00,pkVar29);
              }
              else {
LAB_001313fa:
                iVar18 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         ::find(&this_01->_M_t,pkVar29);
                if ((_Rb_tree_header *)iVar18._M_node == p_Var2) {
                  iVar12 = std::__cxx11::string::compare((char *)pkVar29);
                  if (iVar12 == 0) {
                    local_34[0] = 0;
                  }
                  else {
                    iVar12 = std::__cxx11::string::compare((char *)pkVar29);
                    if (iVar12 == 0) {
                      local_34[0] = 0x20000000;
                    }
                  }
                  goto LAB_0013142a;
                }
                pmVar21 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          ::operator[](this_01,pkVar29);
              }
LAB_00131425:
              local_34[0] = *pmVar21;
            }
LAB_0013142a:
            pbVar23 = (__k->Right).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (uVar27 + 1 <
                (ulong)((long)(__k->Right).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar23 >> 5)) {
              bVar35 = false;
              uVar32 = uVar27 + 1;
              do {
                uVar15 = uVar32;
                if ((byte)(*pbVar23[uVar15]._M_dataplus._M_p | 2U) != 0x3e) break;
                if (local_34[0] == 0xffffffff) {
                  bVar35 = true;
                }
                else {
                  uVar27 = (long)rhs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                 ._M_impl.super__Vector_impl_data._M_start - (long)puStack_108;
                  std::__cxx11::string::substr((ulong)auStack_88,(ulong)(pbVar23 + uVar15));
                  iVar18 = std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                   *)&checkForErrorAndReport.errorCount,(key_type *)auStack_88);
                  if (iVar18._M_node == (_Base_ptr)&nonTerminals) {
                    pmVar21 = std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                            *)&checkForErrorAndReport.errorCount,
                                           (key_type *)auStack_88);
                    *pmVar21 = local_38;
                    local_38 = local_38 + 1;
                  }
                  pmVar21 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                          *)&checkForErrorAndReport.errorCount,
                                         (key_type *)auStack_88);
                  auStack_68._0_4_ = *pmVar21;
                  puStack_a8 = (uint *)CONCAT44(nonterm,(int)(uVar27 >> 2));
                  this_02 = std::
                            map<unsigned_int,_SGParser::Generator::Production::ConflictAction,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SGParser::Generator::Production::ConflictAction>_>_>
                            ::operator[]((map<unsigned_int,_SGParser::Generator::Production::ConflictAction,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SGParser::Generator::Production::ConflictAction>_>_>
                                          *)&p.LeftChain.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                         (key_type *)&stack0xffffffffffffff58);
                  p_Var30 = (this_02->Actions)._M_t._M_impl.super__Rb_tree_header._M_header.
                            _M_parent;
                  p_Var26 = &(this_02->Actions)._M_t._M_impl.super__Rb_tree_header;
                  p_Var25 = &p_Var26->_M_header;
                  for (; p_Var30 != (_Base_ptr)0x0; p_Var30 = (&p_Var30->_M_left)[bVar34]) {
                    bVar34 = p_Var30[1]._M_color < (uint)auStack_68._0_4_;
                    if (!bVar34) {
                      p_Var25 = p_Var30;
                    }
                  }
                  p_Var30 = &p_Var26->_M_header;
                  if (((_Rb_tree_header *)p_Var25 != p_Var26) &&
                     (p_Var30 = p_Var25, (uint)auStack_68._0_4_ < p_Var25[1]._M_color)) {
                    p_Var30 = &p_Var26->_M_header;
                  }
                  if ((_Rb_tree_header *)p_Var30 == p_Var26) {
                    cVar5 = *(__k->Right).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar15]._M_dataplus._M_p;
                    pmVar16 = std::
                              map<unsigned_int,_SGParser::Generator::Production::ConflictAction::Action,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SGParser::Generator::Production::ConflictAction::Action>_>_>
                              ::operator[](&this_02->Actions,(key_type *)auStack_68);
                    *pmVar16 = (uint)(cVar5 != '>');
                  }
                  else {
                    CreateSymbolMap::anon_class_16_2_e3ac8062::operator()
                              ((anon_class_16_2_e3ac8062 *)local_158,line,
                               "Multiple conflict actions on nonterminal %s before \'%s\'",
                               auStack_88,(pkVar29->_M_dataplus)._M_p);
                  }
                  if (auStack_88 !=
                      (undefined1  [8])
                      &leftSymbolId.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish) {
                    operator_delete((void *)auStack_88,
                                    (long)leftSymbolId.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_finish + 1);
                  }
                }
                pbVar23 = (__k->Right).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                uVar32 = uVar15 + 1;
                uVar27 = uVar15;
              } while (uVar15 + 1 <
                       (ulong)((long)(__k->Right).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar23 >> 5
                              ));
            }
            else {
              bVar35 = false;
            }
            if (bVar35) {
              CreateSymbolMap::anon_class_16_2_e3ac8062::operator()
                        ((anon_class_16_2_e3ac8062 *)local_158,line,
                         "Conflict actions before nonterminal %s",(pkVar29->_M_dataplus)._M_p);
            }
            if (local_34[0] == 0xffffffff) {
              iVar18 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                       ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                               *)&checkForErrorAndReport.errorCount,pkVar29);
              if (iVar18._M_node == (_Base_ptr)&nonTerminals) {
                pmVar21 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                        *)&checkForErrorAndReport.errorCount,pkVar29);
                *pmVar21 = local_38;
                local_38 = local_38 + 1;
              }
              pmVar21 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                      *)&checkForErrorAndReport.errorCount,pkVar29);
              local_34[0] = *pmVar21;
            }
            else {
              local_34[0] = local_34[0] | 0x80000000;
              p_Var30 = (this->UserLex).Precedence._M_t._M_impl.super__Rb_tree_header._M_header.
                        _M_parent;
              p_Var25 = &p_Var3->_M_header;
              for (; (_Rb_tree_header *)p_Var30 != (_Rb_tree_header *)0x0;
                  p_Var30 = (&p_Var30->_M_left)[bVar35]) {
                bVar35 = (uint)*(size_t *)(p_Var30 + 1) < local_34[0];
                if (!bVar35) {
                  p_Var25 = p_Var30;
                }
              }
              p_Var26 = p_Var3;
              if (((_Rb_tree_header *)p_Var25 != p_Var3) &&
                 (p_Var26 = (_Rb_tree_header *)p_Var25,
                 local_34[0] < (uint)((_Rb_tree_header *)p_Var25)->_M_node_count)) {
                p_Var26 = p_Var3;
              }
              if (p_Var26 == p_Var3) {
                prec = 0;
              }
              else {
                pmVar17 = std::
                          map<unsigned_int,_SGParser::Generator::Grammar::TerminalPrec,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SGParser::Generator::Grammar::TerminalPrec>_>_>
                          ::operator[](&(this->UserLex).Precedence,local_34);
                prec = pmVar17->Value & 0x3fffffff;
              }
            }
            uVar11 = uVar13;
            if (cVar4 != '$') {
              iVar18 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                       ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                               *)vStack_a0.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,pkVar29);
              kVar10 = local_34[0];
              if (iVar18._M_node ==
                  (_Base_ptr)nonTerminals._M_t._M_impl.super__Rb_tree_header._M_node_count) {
                pmVar21 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                        *)vStack_a0.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,pkVar29
                                      );
                *pmVar21 = kVar10;
              }
              if (rhs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start ==
                  rhs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>
                          ((vector<unsigned_int,std::allocator<unsigned_int>> *)&puStack_108,
                           (iterator)
                           rhs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start,local_34);
              }
              else {
                *rhs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start = local_34[0];
                rhs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start =
                     rhs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start + 1;
              }
            }
          }
          if (cVar4 == '*') break;
          uVar27 = uVar27 + 1;
          pbVar23 = (__k->Right).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar27 < (ulong)((long)(__k->Right).
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar23
                                 >> 5));
      }
      if (((ulong)rhs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage & 1) != 0) {
        auStack_68 = (undefined1  [8])0x0;
        leftSymbolErrorTerminal.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        leftSymbolErrorTerminal.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        vStack_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (uint *)0x0;
        puStack_a8 = (uint *)0x0;
        vStack_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (uint *)0x0;
        while( true ) {
          puVar31 = leftSymbolErrorTerminal.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pbVar23 = (__k->Right).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          auVar8 = auStack_68;
          if ((ulong)((long)(__k->Right).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar23 >> 5) <=
              uVar27) break;
          pkVar29 = pbVar23 + uVar27;
          cVar4 = *pbVar23[uVar27]._M_dataplus._M_p;
          if (cVar4 == '*') {
            for (; auVar8 != (undefined1  [8])puVar31; auVar8 = (undefined1  [8])((long)auVar8 + 4))
            {
              local_ac = *(uint *)auVar8;
              p_Var20 = (_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                         *)std::
                           map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                           ::operator[]((map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                                         *)&p.ConflictActions._M_t._M_impl.super__Rb_tree_header.
                                            _M_node_count,&local_ac);
              puVar9 = vStack_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              auStack_88 = (undefined1  [8])p_Var20;
              if (puStack_a8 !=
                  vStack_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                puVar19 = puStack_a8;
                do {
                  std::
                  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  ::
                  _M_insert_unique_<unsigned_int&,std::_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>::_Alloc_node>
                            (p_Var20,(_Base_ptr)(p_Var20 + 8),puVar19,(_Alloc_node *)auStack_88);
                  puVar19 = puVar19 + 1;
                } while (puVar19 != puVar9);
              }
            }
            if ((undefined1  [8])
                leftSymbolErrorTerminal.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != auStack_68) {
              leftSymbolErrorTerminal.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)auStack_68;
            }
            if (vStack_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != puStack_a8) {
              vStack_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start = puStack_a8;
            }
            std::__cxx11::string::substr((ulong)auStack_88,(ulong)pkVar29);
            std::__cxx11::string::operator=((string *)pkVar29,(string *)auStack_88);
            if (auStack_88 !=
                (undefined1  [8])
                &leftSymbolId.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish) {
              operator_delete((void *)auStack_88,
                              (long)leftSymbolId.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish + 1);
            }
LAB_00131a48:
            iVar18 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                             *)&checkForErrorAndReport.errorCount,pkVar29);
            if (iVar18._M_node == (_Base_ptr)&nonTerminals) {
              pmVar21 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                      *)&checkForErrorAndReport.errorCount,pkVar29);
              *pmVar21 = local_38;
              local_38 = local_38 + 1;
            }
            pmVar21 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                    *)&checkForErrorAndReport.errorCount,pkVar29);
            local_34[0] = *pmVar21;
            if (leftSymbolErrorTerminal.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start ==
                leftSymbolErrorTerminal.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)auStack_68,
                         (iterator)
                         leftSymbolErrorTerminal.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start,local_34);
            }
            else {
              *leftSymbolErrorTerminal.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start = local_34[0];
              pvVar22 = &leftSymbolErrorTerminal;
              puVar31 = leftSymbolErrorTerminal.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start;
LAB_00131b04:
              (pvVar22->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start = puVar31 + 1;
            }
          }
          else {
            if (cVar4 != '+') goto LAB_00131a48;
            std::__cxx11::string::substr((ulong)auStack_88,(ulong)pkVar29);
            std::__cxx11::string::operator=((string *)pkVar29,(string *)auStack_88);
            if (auStack_88 !=
                (undefined1  [8])
                &leftSymbolId.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish) {
              operator_delete((void *)auStack_88,
                              (long)leftSymbolId.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish + 1);
            }
            if (*(pkVar29->_M_dataplus)._M_p == '\'') {
              std::__cxx11::string::substr((ulong)auStack_88,(ulong)pkVar29);
              std::__cxx11::string::operator=((string *)pkVar29,(string *)auStack_88);
              if (auStack_88 !=
                  (undefined1  [8])
                  &leftSymbolId.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish) {
                operator_delete((void *)auStack_88,
                                (long)leftSymbolId.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish + 1);
              }
              iVar18 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                       ::find(&this_00->_M_t,pkVar29);
              pcVar28 = "Undefined terminal alias referenced - \'%s\' inside of the %reduce()";
              if ((_Rb_tree_header *)iVar18._M_node == p_Var1) goto LAB_00131b1a;
              puVar19 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                        ::operator[](this_00,pkVar29);
LAB_00131adf:
              local_34[0] = *puVar19 | 0x80000000;
              if (vStack_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start ==
                  vStack_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>
                          ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                           &stack0xffffffffffffff58,
                           (iterator)
                           vStack_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start,local_34);
                goto LAB_00131b0b;
              }
              *vStack_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start = local_34[0];
              pvVar22 = &vStack_a0;
              puVar31 = vStack_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              goto LAB_00131b04;
            }
            iVar18 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     ::find(&this_01->_M_t,pkVar29);
            pcVar28 = "Undefined terminal referenced - \'%s\' inside of the %reduce()";
            if ((_Rb_tree_header *)iVar18._M_node != p_Var2) {
              puVar19 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                        ::operator[](this_01,pkVar29);
              goto LAB_00131adf;
            }
LAB_00131b1a:
            CreateSymbolMap::anon_class_16_2_e3ac8062::operator()
                      ((anon_class_16_2_e3ac8062 *)local_158,line,pcVar28,
                       (pkVar29->_M_dataplus)._M_p);
          }
LAB_00131b0b:
          uVar27 = uVar27 + 1;
        }
        for (; auVar8 != (undefined1  [8])puVar31; auVar8 = (undefined1  [8])((long)auVar8 + 4)) {
          local_ac = *(uint *)auVar8;
          p_Var20 = (_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                     *)std::
                       map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                       ::operator[]((map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                                     *)&p.ConflictActions._M_t._M_impl.super__Rb_tree_header.
                                        _M_node_count,&local_ac);
          puVar9 = vStack_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start;
          auStack_88 = (undefined1  [8])p_Var20;
          if (puStack_a8 !=
              vStack_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start) {
            puVar19 = puStack_a8;
            do {
              std::
              _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              ::
              _M_insert_unique_<unsigned_int&,std::_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>::_Alloc_node>
                        (p_Var20,(_Base_ptr)(p_Var20 + 8),puVar19,(_Alloc_node *)auStack_88);
              puVar19 = puVar19 + 1;
            } while (puVar19 != puVar9);
          }
        }
        if (puStack_a8 != (uint *)0x0) {
          operator_delete(puStack_a8,
                          (long)vStack_a0.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)puStack_a8);
        }
        if (auStack_68 != (undefined1  [8])0x0) {
          operator_delete((void *)auStack_68,
                          (long)leftSymbolErrorTerminal.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)auStack_68);
        }
      }
      auStack_88 = (undefined1  [8])0x0;
      leftSymbolId.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      leftSymbolId.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      leftSymbolErrorTerminal.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      auStack_68 = (undefined1  [8])0x0;
      leftSymbolErrorTerminal.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      pbVar23 = (__k->Left).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((__k->Left).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != pbVar23) {
        uVar27 = 0;
        do {
          pkVar29 = pbVar23 + uVar27;
          iVar18 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                           *)&checkForErrorAndReport.errorCount,pkVar29);
          if (iVar18._M_node == (_Base_ptr)&nonTerminals) {
            local_34[0] = local_38;
            pmVar21 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                    *)&checkForErrorAndReport.errorCount,pkVar29);
            kVar10 = local_34[0];
            *pmVar21 = local_38;
            pmVar21 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                    *)vStack_a0.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,pkVar29);
            local_38 = local_38 + 1;
            *pmVar21 = kVar10;
          }
          else {
            pmVar21 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                    *)&checkForErrorAndReport.errorCount,pkVar29);
            local_34[0] = *pmVar21;
          }
          if (leftSymbolId.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start ==
              leftSymbolId.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)auStack_88,
                       (iterator)
                       leftSymbolId.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start,local_34);
          }
          else {
            *leftSymbolId.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start = local_34[0];
            leftSymbolId.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start =
                 leftSymbolId.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start + 1;
          }
          uVar32 = uVar27 + 1;
          pbVar23 = (__k->Left).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((uVar32 < (ulong)((long)(__k->Left).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar23 >>
                               5)) && (*pbVar23[uVar32]._M_dataplus._M_p == '%')) {
            iVar18 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                             *)vStack_a0.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,pbVar23 + uVar32);
            if (iVar18._M_node ==
                (_Base_ptr)nonTerminals._M_t._M_impl.super__Rb_tree_header._M_node_count) {
              uVar24 = uVar11 + 1;
              uVar13 = uVar11 | 0x40000000;
            }
            else {
              pmVar21 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                      *)vStack_a0.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                     (__k->Left).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + uVar32);
              uVar13 = *pmVar21;
              uVar24 = uVar11;
            }
            puStack_a8 = (uint *)CONCAT44(nonterm,uVar13);
            uVar27 = uVar32;
            uVar11 = uVar24;
            if (leftSymbolErrorTerminal.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start ==
                leftSymbolErrorTerminal.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_68,
                         (iterator)
                         leftSymbolErrorTerminal.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start,(uint *)&stack0xffffffffffffff58);
            }
            else {
              *leftSymbolErrorTerminal.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start = uVar13;
              leftSymbolErrorTerminal.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start =
                   leftSymbolErrorTerminal.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start + 1;
            }
          }
          else {
            puStack_a8 = (uint *)((ulong)puStack_a8 & 0xffffffff00000000);
            if (leftSymbolErrorTerminal.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start ==
                leftSymbolErrorTerminal.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_68,
                         (iterator)
                         leftSymbolErrorTerminal.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start,(uint *)&stack0xffffffffffffff58);
            }
            else {
              *leftSymbolErrorTerminal.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start = 0;
              leftSymbolErrorTerminal.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start =
                   leftSymbolErrorTerminal.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start + 1;
            }
          }
          uVar27 = uVar27 + 1;
          pbVar23 = (__k->Left).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar27 < (ulong)((long)(__k->Left).
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar23
                                 >> 5));
      }
      if ((undefined1  [8])
          leftSymbolId.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != auStack_88) {
        uVar27 = 0;
        do {
          puVar31 = rhs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          puVar19 = puStack_108;
          uVar13 = *(uint *)((long)auStack_88 + uVar27 * 4);
          local_34[0] = uVar13;
          pmVar14 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                    ::operator[](&data->ProductionLines,&__k->Name);
          uVar32 = (long)puVar31 - (long)puVar19;
          pright = (uint *)0x0;
          if (uVar32 != 0) {
            pright = puVar19;
          }
          Production::SetProduction
                    ((Production *)local_298,&__k->Name,uVar13,pright,(uint)(uVar32 >> 2),*pmVar14,
                     prec);
          p.Line._4_4_ = *(pointer)((long)auStack_68 + uVar27 * 4);
          if (p.LeftChain.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start !=
              (pointer)p.ReduceOverrides._M_t._M_impl.super__Rb_tree_header._M_node_count) {
            p.LeftChain.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)p.ReduceOverrides._M_t._M_impl.super__Rb_tree_header._M_node_count;
          }
          if ((undefined1  [8])
              leftSymbolId.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != auStack_88) {
            lVar33 = 0;
            uVar32 = 0;
            do {
              if (uVar27 != uVar32) {
                if (p.LeftChain.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start ==
                    p.LeftChain.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
                  std::vector<unsigned_int,std::allocator<unsigned_int>>::
                  _M_realloc_insert<unsigned_int_const&>
                            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                             &p.ReduceOverrides._M_t._M_impl.super__Rb_tree_header._M_node_count,
                             (iterator)
                             p.LeftChain.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start,(uint *)((long)auStack_88 + lVar33));
                }
                else {
                  *p.LeftChain.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start = *(uint *)((long)auStack_88 + lVar33);
                  p.LeftChain.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start =
                       p.LeftChain.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start + 1;
                }
              }
              uVar32 = uVar32 + 1;
              lVar33 = lVar33 + 4;
            } while (uVar32 < (ulong)((long)leftSymbolId.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_start -
                                      (long)auStack_88 >> 2));
          }
          std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
          ::clear((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                   *)&p.NotReported);
          if (((ulong)rhs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage & 1) != 0) {
            std::
            _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
            ::operator=((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                         *)&p.NotReported,
                        (_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                         *)&p.ConflictActions._M_t._M_impl.super__Rb_tree_header._M_node_count);
          }
          if (__k->NotReported == true) {
            p.Line._0_1_ = 1;
          }
          std::
          vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
          ::push_back(productions,(value_type *)local_298);
          uVar27 = uVar27 + 1;
        } while (uVar27 < (ulong)((long)leftSymbolId.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start - (long)auStack_88
                                 >> 2));
      }
      if (auStack_68 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_68,
                        (long)leftSymbolErrorTerminal.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)auStack_68);
      }
      if (auStack_88 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_88,
                        (long)leftSymbolId.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)auStack_88);
      }
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                   *)&p.ConflictActions._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (puStack_108 != (uint *)0x0) {
        operator_delete(puStack_108,
                        (long)rhs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puStack_108);
      }
      Production::~Production((Production *)local_298);
      __k = __k + 1;
    } while (__k != pPVar6);
  }
  pkVar29 = (data->OrderedStartSymbols).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pkVar7 = (data->OrderedStartSymbols).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pkVar29 != pkVar7) {
    do {
      iVar18 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                       *)&checkForErrorAndReport.errorCount,pkVar29);
      if (iVar18._M_node == (_Base_ptr)&nonTerminals) {
        pmVar14 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                  ::operator[](&data->ProductionStartSymbols,pkVar29);
        CreateSymbolMap::anon_class_16_2_e3ac8062::operator()
                  ((anon_class_16_2_e3ac8062 *)local_158,*pmVar14,
                   "Undefined production starting symbol %s",(pkVar29->_M_dataplus)._M_p);
      }
      else {
        __position._M_current =
             (startSymbols->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
             .super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (startSymbols->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)startSymbols,__position,
                     &iVar18._M_node[2]._M_color);
        }
        else {
          *__position._M_current = iVar18._M_node[2]._M_color;
          (startSymbols->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      pkVar29 = pkVar29 + 1;
    } while (pkVar29 != pkVar7);
  }
  bVar35 = reduceData._M_t._M_impl.super__Rb_tree_header._M_node_count == 0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               *)&checkForErrorAndReport.errorCount);
  return bVar35;
}

Assistant:

bool StdGrammarParseData::CreateSymbolMap(StdGrammarParseHandler& data,
                                          std::map<String, unsigned>& symbols,
                                          std::vector<Production>& productions,
                                          std::vector<unsigned>& startSymbols) {
    size_t errorCount = 0u;

    // Check for an error and report if needed
    const auto checkForErrorAndReport = [&](size_t line, const char* text...) {
        if (Messages.GetMessageFlags() & ParseMessageBuffer::MessageError) {
            va_list argList;
            va_start(argList, text);
            const auto msgText = StringWithVAFormat(text, argList);
            va_end(argList);

            const ParseMessage msg{ParseMessage::ErrorMessage, "", msgText, 0u, line};
            Messages.AddMessage(msg);
        }
        ++errorCount;
    };

    std::map<String, unsigned> nonTerminals;

    // NonTerminal id counter
    auto idCounter         = 0u;
    // Terminal id counter - extra terminals will be added to handle %error(Name)
    auto terminalIdCounter = unsigned(UserLex.TokenLexemes.size()) + TokenCode::TokenFirstID;

    for (auto& prod: data.Productions) {
        Production                             p;
        std::vector<unsigned>                  rhs;
        std::map<unsigned, std::set<unsigned>> reduceData;
        unsigned symbolId;
        unsigned precValue   = 0u;
        bool     reduceValue = false;
        size_t   iright;
        auto&    left        = prod.Left;
        auto&    right       = prod.Right;
        size_t   line        = data.ProductionLines[prod.Name];

        // Form right hand side list
        for (iright = 0u; iright < right.size(); ++iright) {
            bool  prec   = false;
            auto& symbol = right[iright];

            // Check to see if it is the beginning of the reduce overrides
            if (symbol[0u] == '*') {
                reduceValue = true;
                break;
            }

            // Check for precedence
            if (symbol[0u] == '$') {
                // Eat precedence marker '$'
                symbol = symbol.substr(1u);
                prec   = true;
            }

            // Search to see if it is a terminal
            symbolId = NFA::InvalidLexeme;
            // Terminal alias references will have special ' marker up front
            if (symbol[0u] == '\'') {
                // Eat alias marker quote
                symbol = symbol.substr(1u);

                if (UserLex.LexemeAliasToToken.find(symbol) != UserLex.LexemeAliasToToken.end())
                    symbolId = UserLex.LexemeAliasToToken[symbol];
                else
                    // ERROR: Undefined alias referenced
                    checkForErrorAndReport(line, "Undefined alias referenced - '%s'",
                                           symbol.data());
            } else {
                // If symbol has a % in front of it, it must be one of %error( ) directives
                if (symbol[0u] == '%' && symbol[6u] == '(') {
                    // Must be %error(Name)
                    // Make an error terminal, and reference it
                    // Assign it an Id, so it will be stored as a terminal in Symbols
                    if (symbols.find(symbol) == symbols.end())
                        symbolId = terminalIdCounter++ | ProductionMask::ErrorTerminal;
                    else
                        symbolId = symbols[symbol];
                } else {
                    // Standard terminal processing
                    // See if this is a terminal name declared in expressions
                    if (UserLex.LexemeNameToToken.find(symbol) != UserLex.LexemeNameToToken.end())
                        symbolId = UserLex.LexemeNameToToken[symbol];
                    // Special terminal - error, code TokenCode::TCode::TokenError
                    else if (symbol == "%error")
                        symbolId = TokenCode::TokenError;
                    else if (symbol == "%error_backtrack")
                        symbolId = TokenCode::TokenError | ProductionMask::BacktrackError;
                    else {} // Otherwise it is an error
                }
            }

            // Read in any conflict actions
            bool conflictActionsError = false;

            while (iright + 1u < right.size() &&
                   (right[iright + 1u][0u] == '>' || right[iright + 1u][0u] == '<')) {
                ++iright;
                // Terminal must follow %shifton, %reduceon
                if (symbolId != NFA::InvalidLexeme) {
                    // Get nonterminal id
                    unsigned   id;
                    const auto index = rhs.size();
                    const auto s     = right[iright].substr(1u);

                    // Get Nonterminal Id
                    // If this nonterminal wasn't seen yet, assign it an id
                    if (nonTerminals.find(s) == nonTerminals.end())
                        nonTerminals[s] = idCounter++;
                    id = nonTerminals[s];

                    // Make sure there isn't an action on this nonterminal already
                    Production::ConflictAction & action = p.ConflictActions[unsigned(index)];
                    if (action.Actions.find(id) != action.Actions.end())
                        // Error: Multiple conflict
                        checkForErrorAndReport(line,
                                               "Multiple conflict actions on nonterminal %s before '%s'",
                                               s.data(), symbol.data());
                    else
                        // Store action
                        action.Actions[id] = right[iright][0u] == '>'
                                                 ? Production::ConflictAction::Action::Shift
                                                 : Production::ConflictAction::Action::Reduce;
                } else
                    // Conflict actions can only appear before a terminal
                    conflictActionsError = true;
            }

            // Conflict actions defined for nonterminal
            if (conflictActionsError)
                // Error: Multiple conflict actions
                checkForErrorAndReport(line, "Conflict actions before nonterminal %s",
                                       symbol.data());

            // Terminal - mark it with Terminal flag
            if (symbolId != NFA::InvalidLexeme) {
                symbolId |= ProductionMask::Terminal;

                // Get the precedence value
                if (UserLex.Precedence.find(symbolId) != UserLex.Precedence.end())
                    precValue = UserLex.Precedence[symbolId].Value &
                                Grammar::TerminalPrec::PrecMask;
                else
                    precValue = 0u;
            } else {
                // It's a nonterminal
                // If it's not defined yet, assign an Id to this nonterminal
                if (nonTerminals.find(symbol) == nonTerminals.end())
                    nonTerminals[symbol] = idCounter++;
                // And return Id to store
                symbolId = nonTerminals[symbol];
            }

            if (!prec) {
                // Make sure to add it to grammarSymbols
                if (symbols.find(symbol) == symbols.end())
                    symbols[symbol] = symbolId;

                // And store Id into production
                rhs.push_back(symbolId);
            }
        }

        // Build reduce overrides map
        if (reduceValue) {
            std::vector<unsigned> nonTerminalIds;
            std::vector<unsigned> terminalIds;

            for (auto ireduce = iright; ireduce < right.size(); ++ireduce) {
                auto& symbol = right[ireduce];

                // It is a terminal
                if (symbol[0u] == '+') {
                    symbol = symbol.substr(1u);
                    // Terminal alias references will have special ' marker up front
                    if (symbol[0u] == '\'') {
                        // Eat alias marker quote
                        symbol = symbol.substr(1u);

                        if (UserLex.LexemeAliasToToken.find(symbol) !=
                            UserLex.LexemeAliasToToken.end()) {
                            symbolId = UserLex.LexemeAliasToToken[symbol] |
                                       ProductionMask::Terminal;
                            terminalIds.push_back(symbolId);
                        } else
                            // ERROR: Undefined terminal alias referenced
                            checkForErrorAndReport(line,
                                                   "Undefined terminal alias referenced - '%s' inside of the %reduce()",
                                                   symbol.data());
                    } else if (UserLex.LexemeNameToToken.find(symbol) !=
                               UserLex.LexemeNameToToken.end()) {
                        symbolId = UserLex.LexemeNameToToken[symbol] | ProductionMask::Terminal;
                        terminalIds.push_back(symbolId);
                    } else
                        // ERROR: Undefined terminal referenced
                        checkForErrorAndReport(line,
                                               "Undefined terminal referenced - '%s' inside of the %reduce()",
                                               symbol.data());
                    continue;
                }

                // It is the first Nonterminal in the set
                if (symbol[0u] == '*') {
                    // store the last reduce data
                    for (const auto nonterm: nonTerminalIds)
                        reduceData[nonterm].insert(terminalIds.begin(), terminalIds.end());

                    // Reset the arrays
                    nonTerminalIds.clear();
                    terminalIds.clear();

                    // Eat the '*' marker
                    symbol = symbol.substr(1u);
                }

                // If it's not defined yet, assign an Id to this nonterminal
                if (nonTerminals.find(symbol) == nonTerminals.end())
                    nonTerminals[symbol] = idCounter++;
                // And return Id to store
                symbolId = nonTerminals[symbol];

                nonTerminalIds.push_back(symbolId);
            }

            // Store the last reduce data
            for (const auto nonterm: nonTerminalIds)
                reduceData[nonterm].insert(terminalIds.begin(), terminalIds.end());
        }

        // Build an array of LHS nonterminal symbol ids
        std::vector<unsigned> leftSymbolId;
        std::vector<unsigned> leftSymbolErrorTerminal;

        for (size_t ileft = 0u; ileft < left.size(); ++ileft) {
            // Store & get id for Left nonterminal
            const auto& symbol = left[ileft];

            if (nonTerminals.find(symbol) != nonTerminals.end())
                symbolId = nonTerminals[symbol];
            else {
                // Assign nonterminal Id
                symbolId = idCounter++;
                nonTerminals[symbol] = symbolId;
                // And record nonterminal symbol
                symbols[symbol]      = symbolId;
            }
            leftSymbolId.push_back(symbolId);

            // If we have associated %error
            if (ileft + 1u < left.size() && left[ileft + 1u][0u] == '%') {
                // Store error terminal's symbol id (might need to assign a new one)
                leftSymbolErrorTerminal.push_back(
                    symbols.find(left[ileft + 1u]) == symbols.end()
                        ? terminalIdCounter++ | ProductionMask::ErrorTerminal
                        : symbols[left[ileft + 1u]]);
                ++ileft;
            } else
                leftSymbolErrorTerminal.push_back(0);
        }

        // Store a production for all left hand side nonterminals
        for (size_t ileft = 0u; ileft < leftSymbolId.size(); ++ileft) {
            // Get the symbol id
            symbolId = leftSymbolId[ileft];

            // Finally store production value
            unsigned* const rght = rhs.size() ? &rhs[0] : nullptr;
            p.SetProduction(prod.Name, symbolId, rght, unsigned(rhs.size()),
                            data.ProductionLines[prod.Name], precValue);
            p.ErrorTerminal = leftSymbolErrorTerminal[ileft];

            // Build the left hand chain
            p.LeftChain.clear();
            for (size_t ichain = 0u; ichain < leftSymbolId.size(); ++ichain)
                // Make sure not to add the same nonterminal
                if (ichain != ileft)
                    p.LeftChain.push_back(leftSymbolId[ichain]);

            // Add the reduce overrides data
            p.ReduceOverrides.clear();
            if (reduceValue)
                p.ReduceOverrides = reduceData;

            // If its an action production don't report it
            if (prod.NotReported)
                p.NotReported = true;

            productions.push_back(p);
        }
    }

    // Process starting symbols
    for (const auto& symbol: data.OrderedStartSymbols)
        if (const auto inonTerminals = nonTerminals.find(symbol);
            inonTerminals == nonTerminals.end())
            // Error: Undefined production start symbol
            checkForErrorAndReport(data.ProductionStartSymbols[symbol],
                                   "Undefined production starting symbol %s", symbol.data());
        else
            // Store starting production's nonterminal Id
            startSymbols.push_back(inonTerminals->second);

    return errorCount == 0u;
}